

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_change_leaf(lyd_node_leaf_list *leaf,char *val_str)

{
  uint16_t uVar1;
  lys_node *plVar2;
  char *value;
  char *__ptr;
  int iVar3;
  LY_ERR *pLVar4;
  char *pcVar5;
  lys_type *plVar6;
  bool bVar7;
  char *local_68;
  char *local_58;
  uint local_48;
  uint32_t i;
  LY_DATA_TYPE backup_type;
  lys_node_list *slist;
  lyd_node *parent;
  lyd_val backup_val;
  char *backup;
  char *val_str_local;
  lyd_node_leaf_list *leaf_local;
  
  if (leaf == (lyd_node_leaf_list *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
    leaf_local._4_4_ = 1;
  }
  else {
    if ((leaf->parent != (lyd_node *)0x0) && (leaf->parent->schema->nodetype == LYS_LIST)) {
      plVar2 = leaf->parent->schema;
      for (local_48 = 0; local_48 < plVar2->padding[2]; local_48 = local_48 + 1) {
        if ((char *)**(long **)(*(long *)&plVar2[1].flags + (ulong)local_48 * 8) ==
            leaf->schema->name) {
          ly_vlog(LYE_SPEC,LY_VLOG_LYD,leaf,"List key value cannot be changed.");
          return 1;
        }
      }
    }
    local_58 = val_str;
    if (val_str == (char *)0x0) {
      local_58 = "";
    }
    iVar3 = strcmp(leaf->value_str,local_58);
    if (iVar3 == 0) {
      leaf_local._4_4_ = 0;
    }
    else {
      value = leaf->value_str;
      uVar1 = leaf->value_type;
      __ptr = (leaf->value).binary;
      local_68 = val_str;
      if (val_str == (char *)0x0) {
        local_68 = "";
      }
      pcVar5 = lydict_insert(leaf->schema->module->ctx,local_68,0);
      leaf->value_str = pcVar5;
      plVar6 = lyp_parse_value((lys_type *)&leaf->schema[1].ref,&leaf->value_str,(lyxml_elem *)0x0,
                               leaf,(lyd_attr *)0x0,1,0);
      if (plVar6 == (lys_type *)0x0) {
        lydict_remove(leaf->schema->module->ctx,leaf->value_str);
        leaf->value_str = value;
        (leaf->value).binary = __ptr;
        leaf_local._4_4_ = 1;
      }
      else {
        if (uVar1 == 2) {
          free(__ptr);
        }
        lydict_remove(leaf->schema->module->ctx,value);
        slist = (lys_node_list *)leaf;
        if ((leaf->field_0x9 & 1) != 0) {
          for (; slist != (lys_node_list *)0x0; slist = (lys_node_list *)slist->iffeature) {
            *(byte *)((long)&slist->dsc + 1) = *(byte *)((long)&slist->dsc + 1) & 0xfe;
          }
        }
        iVar3 = ly_new_node_validity(leaf->schema);
        leaf->validity = (uint8_t)iVar3;
        check_leaf_list_backlinks((lyd_node *)leaf,2);
        if ((leaf->schema->flags & 0x100) != 0) {
          slist = (lys_node_list *)leaf->parent;
          while( true ) {
            bVar7 = false;
            if (slist != (lys_node_list *)0x0) {
              bVar7 = *(int *)(slist->name + 0x38) != 0x10;
            }
            if (!bVar7) break;
            slist = (lys_node_list *)slist->iffeature;
          }
          if (slist != (lys_node_list *)0x0) {
            *(byte *)&slist->dsc = *(byte *)&slist->dsc | 1;
          }
        }
        leaf_local._4_4_ = 0;
      }
    }
  }
  return leaf_local._4_4_;
}

Assistant:

API int
lyd_change_leaf(struct lyd_node_leaf_list *leaf, const char *val_str)
{
    const char *backup;
    lyd_val backup_val;
    struct lyd_node *parent;
    struct lys_node_list *slist;
    LY_DATA_TYPE backup_type;
    uint32_t i;

    if (!leaf) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    /* key value cannot be changed */
    if (leaf->parent && (leaf->parent->schema->nodetype == LYS_LIST)) {
        slist = (struct lys_node_list *)leaf->parent->schema;
        for (i = 0; i < slist->keys_size; ++i) {
            if (ly_strequal(slist->keys[i]->name, leaf->schema->name, 1)) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYD, leaf, "List key value cannot be changed.");
                return EXIT_FAILURE;
            }
        }
    }

    if (!strcmp(leaf->value_str, val_str ? val_str : "")) {
        /* the value remains the same */
        return EXIT_SUCCESS;
    }

    backup = leaf->value_str;
    backup_type = leaf->value_type;
    memcpy(&backup_val, &leaf->value, sizeof backup);
    leaf->value_str = lydict_insert(leaf->schema->module->ctx, val_str ? val_str : "", 0);
    /* leaf->value is erased by lyp_parse_value() */

    /* parse the type correctly, makes the value canonical if needed */
    if (!lyp_parse_value(&((struct lys_node_leaf *)leaf->schema)->type, &leaf->value_str, NULL, leaf, NULL, 1, 0)) {
        lydict_remove(leaf->schema->module->ctx, leaf->value_str);
        leaf->value_str = backup;
        memcpy(&leaf->value, &backup_val, sizeof backup);
        return EXIT_FAILURE;
    }
    if (backup_type == LY_TYPE_BITS) {
        free(backup_val.bit);
    }

    /* value is correct, remove backup */
    lydict_remove(leaf->schema->module->ctx, backup);

    /* clear the default flag, the value is different */
    if (leaf->dflt) {
        for (parent = (struct lyd_node *)leaf; parent; parent = parent->parent) {
            parent->dflt = 0;
        }
    }

    /* make the node non-validate */
    leaf->validity = ly_new_node_validity(leaf->schema);

    /* check possible leafref backlinks */
    check_leaf_list_backlinks((struct lyd_node *)leaf, 2);

    if (leaf->schema->flags & LYS_UNIQUE) {
        /* locate the first parent list */
        for (parent = leaf->parent; parent && parent->schema->nodetype != LYS_LIST; parent = parent->parent);

        /* set flag for future validation */
        if (parent) {
            parent->validity |= LYD_VAL_UNIQUE;
        }
    }

    return EXIT_SUCCESS;
}